

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O3

void __thiscall
cmCPackIFWPackage::DependenceStruct::DependenceStruct(DependenceStruct *this,string *dependence)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->Name).field_2;
  (this->Name)._M_dataplus._M_p = (pointer)local_38;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Compare).Type = 0;
  (this->Compare).Value._M_dataplus._M_p = (pointer)&(this->Compare).Value.field_2;
  (this->Compare).Value._M_string_length = 0;
  (this->Compare).Value.field_2._M_local_buf[0] = '\0';
  lVar5 = std::__cxx11::string::find((char)dependence,0x3a);
  if ((lVar5 == -1) && (lVar5 = std::__cxx11::string::find((char)dependence,0x2d), lVar5 == -1)) {
    std::__cxx11::string::_M_assign((string *)this);
    return;
  }
  std::__cxx11::string::substr((ulong)&local_58,(ulong)dependence);
  std::__cxx11::string::operator=((string *)this,(string *)&local_58);
  if ((long *)local_58._M_len != local_48) {
    operator_delete((void *)local_58._M_len,local_48[0] + 1);
  }
  sVar2 = dependence->_M_string_length;
  uVar6 = sVar2 - (lVar5 + 1);
  if (uVar6 != 0) {
    pcVar3 = (dependence->_M_dataplus)._M_p;
    pcVar7 = pcVar3 + lVar5 + 1;
    __str._M_str = "<=";
    __str._M_len = 2;
    local_58._M_len = uVar6;
    local_58._M_str = pcVar7;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_58,0,2,__str);
    if (iVar4 == 0) {
      (this->Compare).Type = 3;
      if (uVar6 < 2) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",2,
                   uVar6);
      }
      local_58._M_len = (size_t)local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar7 + 2,pcVar3 + sVar2)
      ;
    }
    else {
      __str_00._M_str = ">=";
      __str_00._M_len = 2;
      local_58._M_len = uVar6;
      local_58._M_str = pcVar7;
      iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_58,0,2,__str_00)
      ;
      if (iVar4 == 0) {
        (this->Compare).Type = 5;
        if (uVar6 < 2) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     2,uVar6);
        }
        local_58._M_len = (size_t)local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,pcVar7 + 2,pcVar3 + sVar2);
      }
      else {
        cVar1 = *pcVar7;
        if (cVar1 == '>') {
          (this->Compare).Type = 4;
          local_58._M_len = (size_t)local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,pcVar7 + 1,pcVar3 + sVar2);
        }
        else {
          local_58._M_len = (size_t)local_48;
          if (cVar1 == '=') {
            (this->Compare).Type = 1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,pcVar7 + 1,pcVar3 + sVar2);
          }
          else if (cVar1 == '<') {
            (this->Compare).Type = 2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,pcVar7 + 1,pcVar3 + sVar2);
          }
          else {
            (this->Compare).Type = 1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,pcVar7,pcVar3 + sVar2);
          }
        }
      }
    }
    std::__cxx11::string::operator=((string *)&(this->Compare).Value,(string *)&local_58);
    if ((long *)local_58._M_len != local_48) {
      operator_delete((void *)local_58._M_len,local_48[0] + 1);
    }
  }
  return;
}

Assistant:

cmCPackIFWPackage::DependenceStruct::DependenceStruct(
  const std::string& dependence)
{
  // Preferred format is name and version are separated by a colon (:), but
  // note that this is only supported with QtIFW 3.1 or later. Backward
  // compatibility allows a hyphen (-) as a separator instead, but names then
  // cannot contain a hyphen.
  size_t pos;
  if ((pos = dependence.find(':')) == std::string::npos) {
    pos = dependence.find('-');
  }

  if (pos != std::string::npos) {
    this->Name = dependence.substr(0, pos);
    ++pos;
    if (pos == dependence.size()) {
      // Nothing after the separator. Treat this as no version constraint.
      return;
    }

    const auto versionPart =
      cm::string_view(dependence.data() + pos, dependence.size() - pos);

    if (cmHasLiteralPrefix(versionPart, "<=")) {
      this->Compare.Type = cmCPackIFWPackage::CompareLessOrEqual;
      this->Compare.Value = std::string(versionPart.substr(2));
    } else if (cmHasLiteralPrefix(versionPart, ">=")) {
      this->Compare.Type = cmCPackIFWPackage::CompareGreaterOrEqual;
      this->Compare.Value = std::string(versionPart.substr(2));
    } else if (cmHasPrefix(versionPart, '<')) {
      this->Compare.Type = cmCPackIFWPackage::CompareLess;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else if (cmHasPrefix(versionPart, '=')) {
      this->Compare.Type = cmCPackIFWPackage::CompareEqual;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else if (cmHasPrefix(versionPart, '>')) {
      this->Compare.Type = cmCPackIFWPackage::CompareGreater;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else {
      // We found no operator but a version specification is still expected to
      // follow. The default behavior is to treat this the same as =. We
      // explicitly record that as our type (it simplifies our logic a little
      // and is also clearer).
      this->Compare.Type = cmCPackIFWPackage::CompareEqual;
      this->Compare.Value = std::string(versionPart);
    }
  } else {
    this->Name = dependence;
  }
}